

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O0

void * dlsym_wrapper(void *handle,char *symbol_name)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  link_map *plVar5;
  void *pvVar6;
  void *unaff_retaddr;
  char *local_88;
  void *symbol;
  void *handle_1;
  link_map *lib;
  void **wrappee_ptr;
  void *val;
  hash_data_t pvStack_38;
  int result;
  internal_binding_t *binding;
  _func_void_ptr_void_ptr_char_ptr *orig_dlsym;
  _func_void_ptr_char_ptr_int *orig_dlopen;
  char *symbol_name_local;
  void *handle_local;
  
  orig_dlopen = (_func_void_ptr_char_ptr_int *)symbol_name;
  symbol_name_local = (char *)handle;
  orig_dlsym = (_func_void_ptr_void_ptr_char_ptr *)gotcha_get_wrappee(orig_dlopen_handle);
  binding = (internal_binding_t *)gotcha_get_wrappee(orig_dlsym_handle);
  __stream = _stderr;
  pvStack_38 = (hash_data_t)0x0;
  if (0 < debug_level) {
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    local_88 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha_dl.c"
                       ,0x2f);
    if (local_88 == (char *)0x0) {
      local_88 = "";
    }
    fprintf(__stream,"[%d/%d][%s:%u] - User called dlsym(%p, %s)\n",(ulong)uVar1,(ulong)uVar2,
            local_88 + 1,0xa0,symbol_name_local,orig_dlopen);
  }
  iVar3 = lookup_hashtable(&function_hash_table,orig_dlopen,&stack0xffffffffffffffc8);
  handle_local = (void *)(*(code *)binding)(symbol_name_local,orig_dlopen);
  if ((iVar3 == -1) ||
     ((ppvVar4 = getInternalBindingAddressPointer
                           (*(internal_binding_t ***)(*(long *)((long)pvStack_38 + 8) + 0x10)),
      handle_local != (void *)0x0 && (*ppvVar4 != handle_local)))) {
    if (symbol_name_local == (char *)0xffffffffffffffff) {
      plVar5 = gotchas_dlsym_rtld_next_lookup((char *)orig_dlopen,unaff_retaddr);
      if (plVar5 == (link_map *)0x0) {
        handle_local = (void *)0x0;
      }
      else {
        pvVar6 = (*orig_dlsym)(plVar5->l_name,(char *)0x2);
        handle_local = (void *)(*(code *)binding)(pvVar6,orig_dlopen);
      }
    }
  }
  else {
    handle_local = *(void **)(*(long *)((long)pvStack_38 + 8) + 8);
  }
  return handle_local;
}

Assistant:

static void *dlsym_wrapper(void *handle, const char *symbol_name) {
  typeof(&dlopen_wrapper) orig_dlopen = gotcha_get_wrappee(orig_dlopen_handle);
  typeof(&dlsym_wrapper) orig_dlsym = gotcha_get_wrappee(orig_dlsym_handle);
  struct internal_binding_t *binding = NULL;
  debug_printf(1, "User called dlsym(%p, %s)\n", handle, symbol_name);
  int result = lookup_hashtable(&function_hash_table, (hash_key_t)symbol_name,
                                (hash_data_t *)&binding);
  void *val = orig_dlsym(handle, symbol_name);
  if (result != -1) {
    void **wrappee_ptr = getInternalBindingAddressPointer(
        (struct internal_binding_t **)binding->user_binding->function_handle);
    if (val == NULL || *wrappee_ptr == val) {
      // if the wrapper is found and the wrappee is the function requested.
      // This is needed in cases where we wrap a function F1 from library A and
      // we dynamically load function F1 from library B. As name is same, we
      // need to make sure the wrappee are the same as well
      return binding->user_binding->wrapper_pointer;
    }
  }
  if (handle == RTLD_NEXT) {
    struct link_map *lib = gotchas_dlsym_rtld_next_lookup(
        symbol_name, __builtin_return_address(0));
    if (lib) {
      void *handle = orig_dlopen(lib->l_name, RTLD_NOW);
      void *symbol = orig_dlsym(handle, symbol_name);
      return symbol;
    }
    return NULL;
  } else {
    return val;
  }
}